

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,reactive_socket_service<asio::ip::tcp> *this,
          implementation_type *impl,error_code *ec)

{
  int iVar1;
  size_t addr_len;
  endpoint_type endpoint;
  size_t local_38;
  data_union local_2c;
  
  local_2c._8_4_ = 0;
  local_2c._12_4_ = 0;
  local_2c._16_4_ = 0;
  local_2c._20_4_ = 0;
  local_2c.v6.sin6_scope_id = 0;
  local_2c._0_8_ = 2;
  local_38 = 0x1c;
  iVar1 = socket_ops::getpeername
                    ((impl->super_base_implementation_type).socket_,(sockaddr *)&local_2c.base,
                     (socklen_t *)&local_38);
  if (iVar1 == 0) {
    ip::detail::endpoint::resize((endpoint *)&local_2c.base,local_38);
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) =
         CONCAT44(local_2c._16_4_,local_2c._12_4_);
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) =
         CONCAT44(local_2c.v6.sin6_scope_id,local_2c._20_4_);
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = local_2c._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 8) =
         CONCAT44(local_2c._12_4_,local_2c._8_4_);
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x10) = 0;
    (__return_storage_ptr__->impl_).data_.v6.sin6_scope_id = 0;
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
    {
      ASIO_ERROR_LOCATION(ec);
      return endpoint_type();
    }
    endpoint.resize(addr_len);
    return endpoint;
  }